

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceiverPdu.cpp
# Opt level: O2

bool __thiscall DIS::ReceiverPdu::operator==(ReceiverPdu *this,ReceiverPdu *rhs)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  undefined4 unaff_EBP;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  bVar4 = RadioCommunicationsFamilyPdu::operator==
                    (&this->super_RadioCommunicationsFamilyPdu,
                     &rhs->super_RadioCommunicationsFamilyPdu);
  uVar3 = *(uint *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2a;
  uVar6 = *(undefined4 *)&(rhs->super_RadioCommunicationsFamilyPdu).field_0x2a;
  auVar7._0_2_ = -(ushort)((short)uVar6 == (short)uVar3);
  auVar7._2_2_ = -(ushort)((short)((uint)uVar6 >> 0x10) == (short)(uVar3 >> 0x10));
  auVar7._4_2_ = 0xffff;
  auVar7._6_2_ = 0xffff;
  auVar7._8_2_ = 0xffff;
  auVar7._10_2_ = 0xffff;
  auVar7._12_2_ = 0xffff;
  auVar7._14_2_ = 0xffff;
  auVar7 = pshuflw(ZEXT416(uVar3),auVar7,0x50);
  auVar8._0_4_ = auVar7._0_4_;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar7._4_4_;
  auVar8._12_4_ = auVar7._4_4_;
  uVar6 = movmskpd(unaff_EBP,auVar8);
  fVar1 = this->_receivedPower;
  fVar2 = rhs->_receivedPower;
  bVar5 = EntityID::operator==(&this->_transmitterEntityId,&rhs->_transmitterEntityId);
  return (bool)(((bVar5 && this->_transmitterRadioId == rhs->_transmitterRadioId) && fVar1 == fVar2)
                & (byte)uVar6 >> 1 & bVar4 & (byte)uVar6);
}

Assistant:

bool ReceiverPdu::operator ==(const ReceiverPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

     if( ! (_receiverState == rhs._receiverState) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_receivedPower == rhs._receivedPower) ) ivarsEqual = false;
     if( ! (_transmitterEntityId == rhs._transmitterEntityId) ) ivarsEqual = false;
     if( ! (_transmitterRadioId == rhs._transmitterRadioId) ) ivarsEqual = false;

    return ivarsEqual;
 }